

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseNode.cpp
# Opt level: O3

int DefaultComparer<CaseNode_*>::Compare(CaseNode *caseNode1,CaseNode *caseNode2)

{
  int iVar1;
  int32 iVar2;
  int32 iVar3;
  
  iVar2 = CaseNode::GetUpperBoundIntConst(caseNode1);
  iVar3 = CaseNode::GetUpperBoundIntConst(caseNode2);
  iVar1 = ((iVar3 < iVar2) - 1) + (uint)(iVar3 < iVar2);
  if (iVar2 == iVar3) {
    iVar1 = caseNode1->offset - caseNode2->offset;
  }
  return iVar1;
}

Assistant:

int
DefaultComparer<CaseNode *>::Compare(CaseNode* caseNode1, CaseNode* caseNode2)
{
    int caseVal1 = caseNode1->GetUpperBoundIntConst();
    int caseVal2 = caseNode2->GetUpperBoundIntConst();
    uint32 caseOffset1 = caseNode1->GetOffset();
    uint32 caseOffset2 = caseNode2->GetOffset();

    if (caseVal1 == caseVal2)
    {
        return caseOffset1 - caseOffset2;
    }

    if (caseVal1 > caseVal2) return 1;
    return -1;
}